

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result wabt::ReadBinary(void *data,size_t size,BinaryReaderDelegate *delegate,
                       ReadBinaryOptions *options)

{
  Result RVar1;
  ReadModuleOptions local_131;
  undefined1 local_130 [8];
  BinaryReader reader;
  ReadBinaryOptions *options_local;
  BinaryReaderDelegate *delegate_local;
  size_t size_local;
  void *data_local;
  
  reader._248_8_ = options;
  anon_unknown_25::BinaryReader::BinaryReader((BinaryReader *)local_130,data,size,delegate,options);
  local_131.stop_on_first_error = (bool)(*(byte *)(reader._248_8_ + 0x21) & 1);
  RVar1 = anon_unknown_25::BinaryReader::ReadModule((BinaryReader *)local_130,&local_131);
  anon_unknown_25::BinaryReader::~BinaryReader((BinaryReader *)local_130);
  return (Result)RVar1.enum_;
}

Assistant:

Result ReadBinary(const void* data,
                  size_t size,
                  BinaryReaderDelegate* delegate,
                  const ReadBinaryOptions& options) {
  BinaryReader reader(data, size, delegate, options);
  return reader.ReadModule(
      BinaryReader::ReadModuleOptions{options.stop_on_first_error});
}